

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilFile.c
# Opt level: O1

char * Extra_FileReadContents(char *pFileName)

{
  FILE *__stream;
  char *pcVar1;
  
  __stream = fopen(pFileName,"rb");
  if (__stream == (FILE *)0x0) {
    pcVar1 = (char *)0x0;
  }
  else {
    pcVar1 = Extra_FileRead((FILE *)__stream);
    fclose(__stream);
  }
  return pcVar1;
}

Assistant:

char * Extra_FileReadContents( char * pFileName )
{
    FILE * pFile;
    char * pBuffer;
    pFile = fopen( pFileName, "rb" );
    pBuffer = pFile ? Extra_FileRead( pFile ) : NULL;
    if ( pFile )  fclose( pFile );
    return pBuffer;
}